

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

pcap_t * pcap_open_dead_with_tstamp_precision(int linktype,int snaplen,u_int precision)

{
  pcap_t *p;
  u_int precision_local;
  int snaplen_local;
  int linktype_local;
  
  if (precision < 2) {
    _snaplen_local = (pcap_t *)malloc(0x270);
    if (_snaplen_local == (pcap_t *)0x0) {
      _snaplen_local = (pcap_t *)0x0;
    }
    else {
      memset(_snaplen_local,0,0x270);
      _snaplen_local->snapshot = snaplen;
      _snaplen_local->linktype = linktype;
      (_snaplen_local->opt).tstamp_precision = precision;
      _snaplen_local->stats_op = pcap_stats_dead;
      _snaplen_local->cleanup_op = pcap_cleanup_dead;
      _snaplen_local->bpf_codegen_flags = 0;
      _snaplen_local->activated = 1;
    }
  }
  else {
    _snaplen_local = (pcap_t *)0x0;
  }
  return _snaplen_local;
}

Assistant:

pcap_t *
pcap_open_dead_with_tstamp_precision(int linktype, int snaplen, u_int precision)
{
	pcap_t *p;

	switch (precision) {

	case PCAP_TSTAMP_PRECISION_MICRO:
	case PCAP_TSTAMP_PRECISION_NANO:
		break;

	default:
		return NULL;
	}
	p = malloc(sizeof(*p));
	if (p == NULL)
		return NULL;
	memset (p, 0, sizeof(*p));
	p->snapshot = snaplen;
	p->linktype = linktype;
	p->opt.tstamp_precision = precision;
	p->stats_op = pcap_stats_dead;
#ifdef _WIN32
	p->stats_ex_op = (stats_ex_op_t)pcap_not_initialized_ptr;
	p->setbuff_op = pcap_setbuff_dead;
	p->setmode_op = pcap_setmode_dead;
	p->setmintocopy_op = pcap_setmintocopy_dead;
	p->getevent_op = pcap_getevent_dead;
	p->oid_get_request_op = pcap_oid_get_request_dead;
	p->oid_set_request_op = pcap_oid_set_request_dead;
	p->sendqueue_transmit_op = pcap_sendqueue_transmit_dead;
	p->setuserbuffer_op = pcap_setuserbuffer_dead;
	p->live_dump_op = pcap_live_dump_dead;
	p->live_dump_ended_op = pcap_live_dump_ended_dead;
	p->get_airpcap_handle_op = pcap_get_airpcap_handle_dead;
#endif
	p->cleanup_op = pcap_cleanup_dead;

	/*
	 * A "dead" pcap_t never requires special BPF code generation.
	 */
	p->bpf_codegen_flags = 0;

	p->activated = 1;
	return (p);
}